

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void store_perfprof_run(PerfTbl *tbl,PerfProfInputUniqueId *uid,PerfProfRun *run)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  PerfTblEntry *pPVar5;
  int local_3d0;
  undefined1 local_3ca [2];
  int32_t i;
  PerfTblEntry *local_388;
  PerfTblEntry *t;
  PerfTblValue *v;
  undefined1 local_330 [8];
  PerfTblValue zero_value;
  undefined1 local_62 [8];
  PerfTblKey key;
  PerfProfRun *run_local;
  PerfProfInputUniqueId *uid_local;
  PerfTbl *tbl_local;
  
  key.uid.hash.cstr._57_8_ = run;
  printf("Inserting run into table. Instance hash: %d:%s. Run ::: solver_name = %s, time = %.17g, closedProblem = %d, obj_ub = %.17g\n"
         ,(run->solution).stats[0],(run->solution).stats[1],(ulong)uid->seedidx,&uid->hash,run);
  memset(local_62,0,0x42);
  memcpy(local_62,uid,0x42);
  pPVar5 = tbl->buf;
  memcpy((void *)((long)zero_value.runs[7].solution.stats + 0x14),local_62,0x42);
  pPVar5 = (PerfTblEntry *)
           stbds_hmget_key(pPVar5,0x2d0,(void *)((long)zero_value.runs[7].solution.stats + 0x14),
                           0x42,0);
  tbl->buf = pPVar5;
  if ((tbl->buf[-2].value.runs[7].solution.stats[2] == -NAN) ||
     (tbl->buf + (long)tbl->buf[-2].value.runs[7].solution.stats[2] == (PerfTblEntry *)0x0)) {
    memset(local_330,0,0x288);
    pPVar5 = tbl->buf;
    memcpy((void *)((long)&v + 6),local_62,0x42);
    pPVar5 = (PerfTblEntry *)stbds_hmput_key(pPVar5,0x2d0,(void *)((long)&v + 6),0x42,0);
    tbl->buf = pPVar5;
    memcpy(tbl->buf + (long)tbl->buf[-2].value.runs[7].solution.stats[2],local_62,0x42);
    memcpy(&tbl->buf[(long)tbl->buf[-2].value.runs[7].solution.stats[2]].value,local_330,0x288);
  }
  t = (PerfTblEntry *)0x0;
  pPVar5 = tbl->buf;
  memcpy(local_3ca,local_62,0x42);
  pPVar5 = (PerfTblEntry *)stbds_hmget_key(pPVar5,0x2d0,local_3ca,0x42,0);
  tbl->buf = pPVar5;
  local_388 = tbl->buf + (long)tbl->buf[-2].value.runs[7].solution.stats[2];
  if (local_388 == (PerfTblEntry *)0x0) {
    __assert_fail("t",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/tools/perfprof/main.c"
                  ,0x69,"void store_perfprof_run(PerfTbl *, PerfProfInputUniqueId *, PerfProfRun *)"
                 );
  }
  if (local_388 != (PerfTblEntry *)0x0) {
    t = (PerfTblEntry *)&local_388->value;
  }
  if (t != (PerfTblEntry *)0x0) {
    for (local_3d0 = 0; iVar4._0_1_ = (t->key).uid.seedidx, iVar4._1_1_ = (t->key).uid.hash.cstr[0],
        iVar4._2_1_ = (t->key).uid.hash.cstr[1], iVar4._3_1_ = (t->key).uid.hash.cstr[2],
        local_3d0 < iVar4; local_3d0 = local_3d0 + 1) {
      iVar4 = strcmp((char *)key.uid.hash.cstr._57_8_,
                     (t->value).runs[(long)local_3d0 + -1].solver_name + 8);
      if (iVar4 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/tools/perfprof/main.c"
                      ,0x78,
                      "void store_perfprof_run(PerfTbl *, PerfProfInputUniqueId *, PerfProfRun *)");
      }
    }
    iVar1._0_1_ = (t->key).uid.seedidx;
    iVar1._1_1_ = (t->key).uid.hash.cstr[0];
    iVar1._2_1_ = (t->key).uid.hash.cstr[1];
    iVar1._3_1_ = (t->key).uid.hash.cstr[2];
    if ((local_3d0 != iVar1) ||
       (iVar3._0_1_ = (t->key).uid.seedidx, iVar3._1_1_ = (t->key).uid.hash.cstr[0],
       iVar3._2_1_ = (t->key).uid.hash.cstr[1], iVar3._3_1_ = (t->key).uid.hash.cstr[2], 7 < iVar3))
    {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/tools/perfprof/main.c"
                    ,0x80,
                    "void store_perfprof_run(PerfTbl *, PerfProfInputUniqueId *, PerfProfRun *)");
    }
    *(int *)&(t->key).uid = *(int *)&(t->key).uid + 1;
    iVar2._0_1_ = (t->key).uid.seedidx;
    iVar2._1_1_ = (t->key).uid.hash.cstr[0];
    iVar2._2_1_ = (t->key).uid.hash.cstr[1];
    iVar2._3_1_ = (t->key).uid.hash.cstr[2];
    if (iVar2 <= local_3d0) {
      log_log(0x80,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/tools/perfprof/main.c"
              ,0x87,
              "Bad internal error. Too much solvers specified in the same batch, or internal bug!!")
      ;
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/tools/perfprof/main.c"
                    ,0x88,
                    "void store_perfprof_run(PerfTbl *, PerfProfInputUniqueId *, PerfProfRun *)");
    }
    memcpy((t->value).runs[(long)local_3d0 + -1].solver_name + 8,(void *)key.uid.hash.cstr._57_8_,
           0x50);
  }
  return;
}

Assistant:

void store_perfprof_run(PerfTbl *tbl, PerfProfInputUniqueId *uid,
                        PerfProfRun *run) {
    printf("Inserting run into table. Instance hash: %d:%s. Run ::: "
           "solver_name = %s, "
           "time = %.17g, closedProblem = %d, obj_ub "
           "= %.17g\n",
           uid->seedidx, uid->hash.cstr, run->solver_name,
           run->solution.stats[PERFPROF_STAT_KIND_TIME],
           BOOL(run->solution.status & SOLVE_STATUS_CLOSED_PROBLEM),
           run->solution.stats[PERFPROF_STAT_KIND_PRIMAL_BOUND]);

    PerfTblKey key = {0};
    memcpy(&key.uid, uid, sizeof(key.uid));

    if (!hmgetp_null(tbl->buf, key)) {
        PerfTblValue zero_value = {0};
        hmput(tbl->buf, key, zero_value);
    }

    PerfTblValue *v = NULL;
    {
        PerfTblEntry *t = hmgetp(tbl->buf, key);
        assert(t);
        if (t) {
            v = &t->value;
        }
    }

    if (!v) {
        return;
    }

    int32_t i = 0;
    for (i = 0; i < v->num_runs; i++) {
        if (0 == strcmp(run->solver_name, v->runs[i].solver_name)) {
            // Need to update previous perf
            // BUT... This is an invalid case to happen
            assert(0);
            break;
        }
    }

    if (i == v->num_runs && (v->num_runs < ARRAY_LEN_i32(v->runs))) {
        v->num_runs++;
    } else {
        assert(0);
    }

    if (i < v->num_runs) {
        memcpy(&v->runs[i], run, MIN(sizeof(v->runs[i]), sizeof(*run)));
    } else {
        log_fatal("Bad internal error. Too much solvers specified in the same "
                  "batch, or internal bug!!");
        assert(0);
        abort();
    }
}